

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fkChildIsModified(Table *pTab,FKey *p,int *aChange,int bChngRowid)

{
  int iVar1;
  int local_30;
  int iChildKey;
  int i;
  int bChngRowid_local;
  int *aChange_local;
  FKey *p_local;
  Table *pTab_local;
  
  local_30 = 0;
  while( true ) {
    if (p->nCol <= local_30) {
      return 0;
    }
    iVar1 = p->aCol[local_30].iFrom;
    if (-1 < aChange[iVar1]) break;
    if ((iVar1 == pTab->iPKey) && (bChngRowid != 0)) {
      return 1;
    }
    local_30 = local_30 + 1;
  }
  return 1;
}

Assistant:

static int fkChildIsModified(
  Table *pTab,                    /* Table being updated */
  FKey *p,                        /* Foreign key for which pTab is the child */
  int *aChange,                   /* Array indicating modified columns */
  int bChngRowid                  /* True if rowid is modified by this update */
){
  int i;
  for(i=0; i<p->nCol; i++){
    int iChildKey = p->aCol[i].iFrom;
    if( aChange[iChildKey]>=0 ) return 1;
    if( iChildKey==pTab->iPKey && bChngRowid ) return 1;
  }
  return 0;
}